

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtooltip.cpp
# Opt level: O0

void __thiscall QTipLabel::updateSize(QTipLabel *this,QPoint *pos)

{
  bool bVar1;
  int iVar2;
  QFont *pQVar3;
  int *piVar4;
  QSize *s1;
  QWidget *in_RSI;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QScreen *screen;
  QSize sh;
  QSize extra;
  QFontMetrics fm;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  uint in_stack_ffffffffffffff74;
  QAnyStringView *in_stack_ffffffffffffff80;
  QWidgetPrivate *pos_00;
  QSize *in_stack_ffffffffffffffa0;
  QWidget *in_stack_ffffffffffffffa8;
  QAnyStringView *local_28;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pos_00 = in_RDI;
  QLabel::d_func((QLabel *)0x4c03e5);
  QWidgetPrivate::setScreenForPoint
            (in_RDI,(QPoint *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar3 = QWidget::font((QWidget *)in_RDI);
  QFontMetrics::QFontMetrics((QFontMetrics *)&local_10,pQVar3);
  QSize::QSize((QSize *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
  iVar2 = QFontMetrics::descent();
  if ((iVar2 == 2) && (iVar2 = QFontMetrics::ascent(), 10 < iVar2)) {
    piVar4 = QSize::rheight((QSize *)0x4c046f);
    *piVar4 = *piVar4 + 1;
  }
  QLabel::text((QLabel *)in_RDI);
  QAnyStringView::QAnyStringView(in_stack_ffffffffffffff80,(QString *)in_RDI);
  Qt::mightBeRichText(local_28);
  QLabel::setWordWrap((QLabel *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                      SUB41((uint)in_stack_ffffffffffffff6c >> 0x18,0));
  QString::~QString((QString *)0x4c04bd);
  (**(code **)(*(long *)in_RDI + 0x70))();
  s1 = (QSize *)getTipScreen((QPoint *)pos_00,in_RSI);
  bVar1 = QLabel::wordWrap((QLabel *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  in_stack_ffffffffffffff74 = in_stack_ffffffffffffff74 & 0xffffff;
  if (!bVar1) {
    in_stack_ffffffffffffff70 = QSize::width((QSize *)0x4c050e);
    in_stack_ffffffffffffffa8 = (QWidget *)QScreen::geometry();
    iVar2 = QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    in_stack_ffffffffffffff74 =
         CONCAT13(iVar2 < in_stack_ffffffffffffff70,(int3)in_stack_ffffffffffffff74);
  }
  if ((char)(in_stack_ffffffffffffff74 >> 0x18) != '\0') {
    QLabel::setWordWrap((QLabel *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                        SUB41((uint)in_stack_ffffffffffffff6c >> 0x18,0));
    in_stack_ffffffffffffffa0 = (QSize *)(**(code **)(*(long *)in_RDI + 0x70))();
  }
  ::operator+(s1,(QSize *)in_RDI);
  QWidget::resize(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  QFontMetrics::~QFontMetrics((QFontMetrics *)&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void  QTipLabel::updateSize(const QPoint &pos)
{
    d_func()->setScreenForPoint(pos);
    // Ensure that we get correct sizeHints by placing this window on the right screen.
    QFontMetrics fm(font());
    QSize extra(1, 0);
    // Make it look good with the default ToolTip font on Mac, which has a small descent.
    if (fm.descent() == 2 && fm.ascent() >= 11)
        ++extra.rheight();
    setWordWrap(Qt::mightBeRichText(text()));
    QSize sh = sizeHint();
    const QScreen *screen = getTipScreen(pos, this);
    if (!wordWrap() && sh.width() > screen->geometry().width()) {
        setWordWrap(true);
        sh = sizeHint();
    }
    resize(sh + extra);
}